

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O3

CProgramPtr __thiscall
Refal2::CInternalProgramBuilder::Build
          (CInternalProgramBuilder *this,CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  CProgram *this_00;
  char *__to;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer __pos;
  CProgramPtr CVar2;
  CInternalProgramBuilder builder;
  CInternalProgramBuilder CStack_78;
  
  this->errors = (CErrorsHelper *)0x0;
  (this->globals).size = 0;
  (this->globals).capacity = 0;
  bVar1 = CErrorsHelper::HasErrors(errors);
  __pos = (modules->
          super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((!bVar1) &&
     (__pos != (modules->
               super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    CInternalProgramBuilder(&CStack_78,errors);
    processModules(&CStack_78,modules,0x129212);
    bVar1 = CErrorsHelper::HasErrors(errors);
    if (!bVar1) {
      check(&CStack_78);
      bVar1 = CErrorsHelper::HasErrors(errors);
      if (!bVar1) {
        this_00 = (CProgram *)operator_new(0x48);
        CProgram::CProgram(this_00,(int)((ulong)((long)(modules->
                                                                                                              
                                                  super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(modules->
                                                                                                            
                                                  super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start) >> 3))
        ;
        std::__shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>::reset<Refal2::CProgram>
                  (&CStack_78.program.
                    super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>,this_00);
        processModules(&CStack_78,modules,0x1293d0);
        bVar1 = CErrorsHelper::HasErrors(errors);
        if (bVar1) {
          __assert_fail("!errors.HasErrors()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                        ,0xe4,
                        "static CProgramPtr Refal2::CInternalProgramBuilder::Build(CModuleDataVector &, CErrorsHelper &)"
                       );
        }
        link(&CStack_78,(char *)modules,__to);
        bVar1 = CErrorsHelper::HasErrors(errors);
        if (bVar1) {
          __assert_fail("!errors.HasErrors()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                        ,0xe6,
                        "static CProgramPtr Refal2::CInternalProgramBuilder::Build(CModuleDataVector &, CErrorsHelper &)"
                       );
        }
        this->errors = (CErrorsHelper *)
                       CStack_78.program.
                       super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->globals,
                   &CStack_78.program.
                    super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    if (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (CStack_78.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    CDictionary<Refal2::CGlobalFunctionData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~CDictionary(&CStack_78.globals);
    __pos = (modules->
            super__Vector_base<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::_M_erase_at_end(modules,__pos);
  CVar2.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar2.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CProgramPtr)CVar2.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CProgramPtr CInternalProgramBuilder::Build( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	CProgramPtr program;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			if( !errors.HasErrors() ) {
				builder.program.reset( new CProgram( modules.size() ) );
				builder.compile( modules );
				assert( !errors.HasErrors() );
				builder.link( modules );
				assert( !errors.HasErrors() );
				program = builder.program;
			}
		}
	}
	modules.clear();
	return program;
}